

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall RoomBase::handle(RoomBase *this,Event *event)

{
  const_iterator __first;
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint *in_RSI;
  undefined8 *in_RDI;
  TTimestamp TVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  Query *query;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Query,_std::allocator<Query>_> *__range3_1;
  bool correct;
  value_type *player_6;
  int i_1;
  int playerId_1;
  PlayerInfo *player_5;
  iterator __end4_3;
  iterator __begin4_3;
  vector<PlayerInfo,_std::allocator<PlayerInfo>_> *__range4_3;
  PlayerInfo player_3;
  PlayerInfo *player_4;
  iterator __end4_2;
  iterator __begin4_2;
  vector<PlayerInfo,_std::allocator<PlayerInfo>_> *__range4_2;
  int i;
  float minScore;
  int playerId;
  Event event_2;
  PlayerInfo *player_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<PlayerInfo,_std::allocator<PlayerInfo>_> *__range4_1;
  int nActive_1;
  Event event_1;
  PlayerInfo *player_1;
  iterator __end4;
  iterator __begin4;
  vector<PlayerInfo,_std::allocator<PlayerInfo>_> *__range4;
  int nActive;
  PlayerInfo *player;
  iterator __end3;
  iterator __begin3;
  vector<PlayerInfo,_std::allocator<PlayerInfo>_> *__range3;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  float fVar12;
  undefined4 in_stack_fffffffffffffc00;
  uint uVar13;
  undefined4 in_stack_fffffffffffffc04;
  uint uVar14;
  undefined4 in_stack_fffffffffffffc08;
  int iVar15;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  Event *in_stack_fffffffffffffc18;
  const_iterator in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  undefined1 local_340 [88];
  reference local_2e8;
  Query *local_2e0;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_2d8;
  undefined8 *local_2d0;
  byte local_2c1;
  reference local_2c0;
  int local_2b8;
  int local_2b4;
  reference local_2b0;
  PlayerInfo *local_2a8;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> local_2a0;
  undefined8 *local_298;
  PlayerInfo local_28c;
  reference local_280;
  PlayerInfo *local_278;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> local_270;
  undefined8 *local_268;
  int local_234;
  float local_230;
  int local_22c;
  undefined4 local_228;
  undefined4 local_224;
  reference local_1f8;
  PlayerInfo *local_1f0;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> local_1e8;
  undefined8 *local_1e0;
  int local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  reference local_150;
  PlayerInfo *local_148;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> local_140;
  undefined8 *local_138;
  int local_12c;
  reference local_d8;
  PlayerInfo *local_d0;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> local_c8;
  undefined8 *local_c0;
  PlayerInfo *local_b8;
  PlayerInfo *local_b0;
  PlayerInfo *local_98;
  PlayerInfo *local_90;
  PlayerInfo *local_88;
  uint *local_10;
  
  local_10 = in_RSI;
  switch(*in_RSI) {
  case 1:
    if (in_RSI[1] == *(uint *)(in_RDI + 1)) {
      *(int *)(in_RDI + 6) = *(int *)(in_RDI + 6) + 1;
      std::vector<Query,_std::allocator<Query>_>::clear
                ((vector<Query,_std::allocator<Query>_> *)0x117735);
      std::vector<Query,_std::allocator<Query>_>::clear
                ((vector<Query,_std::allocator<Query>_> *)0x117749);
      while (sVar3 = std::vector<Query,_std::allocator<Query>_>::size
                               ((vector<Query,_std::allocator<Query>_> *)(in_RDI + 0xe)),
            sVar3 < (ulong)(long)*(int *)((long)in_RDI + 0x34)) {
        (**(code **)*in_RDI)();
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  ((vector<Query,_std::allocator<Query>_> *)
                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (Query *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        Query::~Query((Query *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      }
      local_90 = (PlayerInfo *)
                 std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::begin
                           ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_98 = (PlayerInfo *)
                 std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                           ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_88 = (PlayerInfo *)
                 std::
                 remove_if<__gnu_cxx::__normal_iterator<PlayerInfo*,std::vector<PlayerInfo,std::allocator<PlayerInfo>>>,RoomBase::handle(Event&&)::_lambda(auto:1_const&)_1_>
                           (local_90,local_98);
      __gnu_cxx::
      __normal_iterator<PlayerInfo_const*,std::vector<PlayerInfo,std::allocator<PlayerInfo>>>::
      __normal_iterator<PlayerInfo*>
                ((__normal_iterator<const_PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_b0 = (PlayerInfo *)
                 std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                           ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      __gnu_cxx::
      __normal_iterator<PlayerInfo_const*,std::vector<PlayerInfo,std::allocator<PlayerInfo>>>::
      __normal_iterator<PlayerInfo*>
                ((__normal_iterator<const_PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      __first._M_current._4_4_ = in_stack_fffffffffffffc2c;
      __first._M_current._0_4_ = in_stack_fffffffffffffc28;
      local_b8 = (PlayerInfo *)
                 std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::erase
                           ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                            in_stack_fffffffffffffc18,__first,in_stack_fffffffffffffc20);
      local_c0 = in_RDI + 0x14;
      local_c8._M_current =
           (PlayerInfo *)
           std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::begin
                     ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_d0 = (PlayerInfo *)
                 std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                           ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
            bVar1) {
        local_d8 = __gnu_cxx::
                   __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                   ::operator*(&local_c8);
        local_d8->score = 0.0;
        local_d8->active = '\x01';
        __gnu_cxx::
        __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>::
        operator++(&local_c8);
      }
      TVar7 = anon_unknown.dwarf_1322b::timestamp_s();
      in_RDI[8] = TVar7;
      if ((*(int *)((long)in_RDI + 0xc) != 0) && (*(int *)((long)in_RDI + 0xc) == 1)) {
        in_RDI[9] = in_RDI[10];
      }
      std::function<void()>::function<RoomBase::handle(Event&&)::_lambda()_1_,void>
                ((function<void_()> *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (anon_class_8_1_8991fb9c *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      Notifier::notify((Notifier *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (function<void_()> *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      std::function<void_()>::~function((function<void_()> *)0x1179fc);
    }
    break;
  case 2:
    if (in_RSI[1] == *(uint *)(in_RDI + 1)) {
      if (*(int *)((long)in_RDI + 0xc) == 0) {
        TVar7 = anon_unknown.dwarf_1322b::timestamp_s();
        uVar5 = in_RDI[0xd];
        auVar8._8_4_ = (int)((ulong)uVar5 >> 0x20);
        auVar8._0_8_ = uVar5;
        auVar8._12_4_ = 0x45300000;
        in_RDI[0xb] = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 0.001 +
                      TVar7;
        std::function<void()>::function<RoomBase::handle(Event&&)::_lambda()_2_,void>
                  ((function<void_()> *)
                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (anon_class_8_1_8991fb9c *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        Notifier::notify((Notifier *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (function<void_()> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::function<void_()>::~function((function<void_()> *)0x117b0c);
      }
      else if (*(int *)((long)in_RDI + 0xc) == 1) {
        local_12c = 0;
        local_138 = in_RDI + 0x14;
        local_140._M_current =
             (PlayerInfo *)
             std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::begin
                       ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        local_148 = (PlayerInfo *)
                    std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                              ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
              bVar1) {
          local_150 = __gnu_cxx::
                      __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                      ::operator*(&local_140);
          if (local_150->active != '\0') {
            local_12c = local_12c + 1;
          }
          __gnu_cxx::
          __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>::
          operator++(&local_140);
        }
        if (local_12c < 2) {
          TVar7 = anon_unknown.dwarf_1322b::timestamp_s();
          uVar5 = in_RDI[0xd];
          auVar10._8_4_ = (int)((ulong)uVar5 >> 0x20);
          auVar10._0_8_ = uVar5;
          auVar10._12_4_ = 0x45300000;
          in_RDI[0xb] = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 0.001 +
                        TVar7;
          std::function<void()>::function<RoomBase::handle(Event&&)::_lambda()_4_,void>
                    ((function<void_()> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (anon_class_8_1_8991fb9c *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          Notifier::notify((Notifier *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                           ,(function<void_()> *)
                            CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          std::function<void_()>::~function((function<void_()> *)0x117d54);
        }
        else {
          TVar7 = anon_unknown.dwarf_1322b::timestamp_s();
          uVar5 = in_RDI[0xd];
          auVar9._8_4_ = (int)((ulong)uVar5 >> 0x20);
          auVar9._0_8_ = uVar5;
          auVar9._12_4_ = 0x45300000;
          in_RDI[0xb] = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 0.001 +
                        TVar7;
          std::function<void()>::function<RoomBase::handle(Event&&)::_lambda()_3_,void>
                    ((function<void_()> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (anon_class_8_1_8991fb9c *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          Notifier::notify((Notifier *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                           ,(function<void_()> *)
                            CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          std::function<void_()>::~function((function<void_()> *)0x117c8e);
        }
      }
    }
    break;
  case 3:
    if (in_RSI[1] == *(uint *)(in_RDI + 1)) {
      if (*(int *)((long)in_RDI + 0xc) == 0) {
        Event::Event((Event *)0x117dd5);
        local_1cc = *(undefined4 *)(in_RDI + 1);
        local_1d0 = 2;
        Events::push((Events *)in_stack_fffffffffffffc20._M_current,in_stack_fffffffffffffc18);
        Event::~Event((Event *)0x117e12);
      }
      else if (*(int *)((long)in_RDI + 0xc) == 1) {
        printf("Room %d: ending BR round %d\n",(ulong)*(uint *)(in_RDI + 1),
               (ulong)*(uint *)(in_RDI + 6));
        local_1d4 = 0;
        local_1e0 = in_RDI + 0x14;
        local_1e8._M_current =
             (PlayerInfo *)
             std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::begin
                       ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        local_1f0 = (PlayerInfo *)
                    std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                              ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
              bVar1) {
          local_1f8 = __gnu_cxx::
                      __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                      ::operator*(&local_1e8);
          if (local_1f8->active == '\x01') {
            local_1d4 = local_1d4 + 1;
          }
          __gnu_cxx::
          __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>::
          operator++(&local_1e8);
        }
        if (local_1d4 < 3) {
          printf("Room %d: ending round\n",(ulong)*(uint *)(in_RDI + 1));
          Event::Event((Event *)0x117f40);
          local_224 = *(undefined4 *)(in_RDI + 1);
          local_228 = 2;
          Events::push((Events *)in_stack_fffffffffffffc20._M_current,in_stack_fffffffffffffc18);
          Event::~Event((Event *)0x117f7d);
        }
        else {
          local_22c = -1;
          local_230 = 1e+06;
          local_234 = 0;
          while (iVar15 = local_234,
                sVar3 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::size
                                  ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                                   (in_RDI + 0x14)), iVar15 < (int)sVar3) {
            pvVar4 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                               ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14),
                                (long)local_234);
            if ((pvVar4->score < local_230) &&
               (pvVar4 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                                   ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                                    (in_RDI + 0x14),(long)local_234), pvVar4->active == '\x01')) {
              pvVar4 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                                 ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14)
                                  ,(long)local_234);
              local_230 = pvVar4->score;
              local_22c = local_234;
            }
            local_234 = local_234 + 1;
          }
          pvVar4 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                             ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14),
                              (long)local_22c);
          pvVar4->active = '\x02';
          in_RDI[9] = (double)in_RDI[9] + (double)in_RDI[10];
          std::function<void()>::function<RoomBase::handle(Event&&)::_lambda()_5_,void>
                    ((function<void_()> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (anon_class_8_1_8991fb9c *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          Notifier::notify((Notifier *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                           ,(function<void_()> *)
                            CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          std::function<void_()>::~function((function<void_()> *)0x11812e);
        }
      }
    }
    break;
  case 4:
    if (in_RSI[1] == *(uint *)(in_RDI + 1)) {
      local_268 = in_RDI + 0x14;
      local_270._M_current =
           (PlayerInfo *)
           std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::begin
                     ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_278 = (PlayerInfo *)
                  std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                            ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
            bVar1) {
        local_280 = __gnu_cxx::
                    __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                    ::operator*(&local_270);
        if (local_280->clientId == local_10[2]) {
          local_280->active = '\x01';
          return;
        }
        __gnu_cxx::
        __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>::
        operator++(&local_270);
      }
      PlayerInfo::PlayerInfo(&local_28c);
      iVar15 = *(int *)((long)in_RDI + 0xc);
      if (iVar15 == 0) {
        local_28c.active = '\x01';
      }
      else if (iVar15 == 1) {
        local_28c.active = '\x02';
      }
      local_28c.clientId = local_10[2];
      std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::emplace_back<PlayerInfo>
                ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                 CONCAT44(iVar15,in_stack_fffffffffffffc10),
                 (PlayerInfo *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      uVar13 = local_10[2];
      uVar5 = std::__cxx11::string::c_str();
      printf("Client (%d) joined room \'%s\' (%d)\n",(ulong)uVar13,uVar5,
             (ulong)*(uint *)(in_RDI + 1));
    }
    else {
      local_298 = in_RDI + 0x14;
      local_2a0._M_current =
           (PlayerInfo *)
           std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::begin
                     ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_2a8 = (PlayerInfo *)
                  std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::end
                            ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                (__normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
            bVar1) {
        local_2b0 = __gnu_cxx::
                    __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>
                    ::operator*(&local_2a0);
        if (local_2b0->clientId == local_10[2]) {
          local_2b0->active = '\0';
          uVar13 = local_10[2];
          uVar5 = std::__cxx11::string::c_str();
          printf("Client (%d) left room \'%s\' (%d)\n",(ulong)uVar13,uVar5,
                 (ulong)*(uint *)(in_RDI + 1));
        }
        __gnu_cxx::
        __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_>::
        operator++(&local_2a0);
      }
    }
    break;
  case 5:
    if ((in_RSI[1] == *(uint *)(in_RDI + 1)) &&
       (TVar7 = anon_unknown.dwarf_1322b::timestamp_s(),
       TVar7 <= (double)in_RDI[8] + (double)in_RDI[9])) {
      local_2b4 = -1;
      local_2b8 = 0;
      while (iVar15 = local_2b8,
            sVar3 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::size
                              ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14)),
            iVar15 < (int)sVar3) {
        pvVar4 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                           ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14),
                            (long)local_2b8);
        if (pvVar4->clientId == local_10[2]) {
          local_2b4 = local_2b8;
          break;
        }
        local_2b8 = local_2b8 + 1;
      }
      if ((local_2b4 != -1) &&
         (pvVar4 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                             ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14),
                              (long)local_2b4), pvVar4->active == '\x01')) {
        uVar13 = *(uint *)(in_RDI + 1);
        uVar14 = local_10[2];
        uVar5 = std::__cxx11::string::data();
        printf("Room %d: client %d submitted \'%s\'\n",(ulong)uVar13,(ulong)uVar14,uVar5);
        local_2c0 = std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::operator[]
                              ((vector<PlayerInfo,_std::allocator<PlayerInfo>_> *)(in_RDI + 0x14),
                               (long)local_2b4);
        local_2c1 = 0;
        local_2d0 = in_RDI + 0xe;
        local_2d8._M_current =
             (Query *)std::vector<Query,_std::allocator<Query>_>::begin
                                ((vector<Query,_std::allocator<Query>_> *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        local_2e0 = (Query *)std::vector<Query,_std::allocator<Query>_>::end
                                       ((vector<Query,_std::allocator<Query>_> *)
                                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8
                                                ));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                                   *)CONCAT44(uVar14,uVar13),
                                  (__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
              bVar1) {
          local_2e8 = __gnu_cxx::
                      __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
                      operator*(&local_2d8);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc20._M_current,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc18);
          if (_Var2) {
            uVar6 = std::__cxx11::string::size();
            fVar11 = (float)(long)uVar6;
            fVar12 = (float)uVar6;
            local_2c0->score = fVar12 * 0.2 + 3.0 + local_2c0->score;
            local_2c1 = 1;
            local_2e8->clientId = local_10[2];
            TVar7 = anon_unknown.dwarf_1322b::timestamp_s();
            local_2e8->tGuessed_s = TVar7;
            std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                      ((vector<Query,_std::allocator<Query>_> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (Query *)CONCAT44(in_stack_fffffffffffffc0c,iVar15));
            (**(code **)*in_RDI)(local_340);
            Query::operator=((Query *)CONCAT44(uVar14,uVar13),(Query *)CONCAT44(fVar12,fVar11));
            Query::~Query((Query *)CONCAT44(uVar14,uVar13));
            printf("correct!\n");
            break;
          }
          __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
          operator++(&local_2d8);
        }
        if ((local_2c1 & 1) == 0) {
          printf("wrong!\n");
          local_2c0->score = local_2c0->score - 1.0;
          if (local_2c0->score < 0.0) {
            local_2c0->score = 0.0;
          }
        }
      }
    }
    break;
  default:
    printf("Unhandled event, type = %d\n",(ulong)*in_RSI);
  }
  return;
}

Assistant:

virtual void handle(Event && event) {
        switch (event.type) {
            case Event::StartNewRound:
                {
                    if (event.roomId != id) return;

                    ++roundId;
                    //printf("Room %d: starting new round %d\n", id, roundId);

                    pool.clear();
                    poolOld.clear();
                    while (pool.size() < poolSize) {
                        pool.emplace_back(generate());
                    }

                    players.erase(std::remove_if(players.begin(), players.end(),
                                                 [](const auto & p) { return p.active == 0; }),
                                  players.end());

                    for (auto & player : players) {
                        player.score = 0.0f;
                        player.active = 1;
                    }

                    tRoundStart_s = timestamp_s();

                    switch (mode) {
                        case Standard:
                            {
                            }
                            break;
                        case BattleRoyale:
                            {
                                tRoundLength_s = tBRRoundLength_s;
                            }
                            break;
                    };

                    notifier.notify([&]() {
                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tRoundLength_s)));

                        Event event;
                        event.roomId = id;
                        event.type = Event::EndRound;

                        notifier.events->push(std::move(event));
                    });
                }
                break;
            case Event::CheckStart:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                notifier.notify([&]() {
                                    std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::StartNewRound;

                                    notifier.events->push(std::move(event));
                                });
                            }
                            break;
                        case BattleRoyale:
                            {
                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active != 0) {
                                        ++nActive;
                                    }
                                }

                                if (nActive > 1) {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::StartNewRound;

                                        notifier.events->push(std::move(event));
                                    });
                                } else {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenChecks_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::CheckStart;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::EndRound:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                //printf("Room %d: ending round %d\n", id, roundId);

                                Event event;
                                event.roomId = id;
                                event.type = Event::CheckStart;

                                notifier.events->push(std::move(event));
                            }
                            break;
                        case BattleRoyale:
                            {
                                printf("Room %d: ending BR round %d\n", id, roundId);

                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active == 1) {
                                        ++nActive;
                                    }
                                }

                                if (nActive <= 2) {
                                    printf("Room %d: ending round\n", id);

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::CheckStart;

                                    notifier.events->push(std::move(event));
                                } else {
                                    int playerId = -1;
                                    float minScore = 1e6;
                                    for (int i = 0; i < (int) players.size(); ++i) {
                                        if (players[i].score < minScore && players[i].active == 1) {
                                            minScore = players[i].score;
                                            playerId = i;
                                        }
                                    }

                                    players[playerId].active = 2;

                                    tRoundLength_s += tBRRoundLength_s;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tBRRoundLength_s)));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::EndRound;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::PlayerJoinRoom:
                {
                    if (event.roomId == id) {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 1;
                                return;
                            }
                        }

                        PlayerInfo player;

                        switch (mode) {
                            case Standard:
                                {
                                    player.active = 1;
                                }
                                break;
                            case BattleRoyale:
                                {
                                    player.active = 2;
                                }
                                break;
                        };
                        player.clientId = event.clientId;

                        players.emplace_back(std::move(player));

                        printf("Client (%d) joined room '%s' (%d)\n", event.clientId, name.c_str(), id);
                    } else {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 0;

                                printf("Client (%d) left room '%s' (%d)\n", event.clientId, name.c_str(), id);
                            }
                        }
                    }
                }
                break;
            case Event::PlayerInput:
                {
                    if (event.roomId != id) return;
                    if (::timestamp_s() > tRoundStart_s + tRoundLength_s) return;

                    int playerId = -1;
                    for (int i = 0; i < (int) players.size(); ++i) {
                        if (players[i].clientId == event.clientId) {
                            playerId = i;
                            break;
                        }
                    }

                    if (playerId == -1) return;
                    if (players[playerId].active != 1) return;

                    printf("Room %d: client %d submitted '%s'\n", id, event.clientId, event.inputStr.data());

                    auto & player = players[playerId];

                    bool correct = false;
                    for (auto & query : pool) {
                        if (event.inputStr == query.answer) {
                            player.score += 3.0f + 0.2f*query.answer.size();
                            correct = true;
                            query.clientId = event.clientId;
                            query.tGuessed_s = ::timestamp_s();
                            poolOld.emplace_back(std::move(query));
                            query = generate();
                            printf("correct!\n");

                            break;
                        }
                    }

                    if (correct == false) {
                        printf("wrong!\n");
                        player.score -= 1.0f;
                        if (player.score < 0.0) player.score = 0.0f;
                    }
                }
                break;
            default:
                {
                    printf("Unhandled event, type = %d\n", event.type);
                }
                break;
        };
    }